

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_true>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  vfloat<4> vVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  size_t sVar11;
  _func_int **pp_Var12;
  undefined4 uVar13;
  uint uVar14;
  ulong uVar15;
  ulong extraout_RDX;
  long lVar16;
  size_t sVar17;
  size_t sVar18;
  int iVar19;
  ulong uVar20;
  size_t in_R9;
  ulong uVar21;
  NodeRef *pNVar22;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar23;
  bool bVar24;
  vfloat_impl<4> __tmp;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar34;
  float fVar35;
  undefined1 auVar32 [16];
  float fVar36;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar33;
  float fVar37;
  float fVar43;
  float fVar44;
  vint4 ai;
  float fVar45;
  undefined1 auVar38 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar46;
  float fVar49;
  float fVar50;
  vint4 ai_1;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  vint4 ai_3;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar62;
  float fVar63;
  vint4 bi;
  undefined1 auVar61 [16];
  float fVar64;
  float fVar65;
  float fVar69;
  float fVar70;
  vint4 bi_3;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar71;
  float fVar72;
  float fVar75;
  float fVar76;
  vint4 bi_1;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar77;
  uint uVar78;
  uint uVar82;
  uint uVar83;
  vint4 ai_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  uint uVar84;
  undefined1 auVar81 [16];
  uint uVar85;
  uint uVar86;
  uint uVar87;
  vint4 bi_2;
  uint uVar88;
  float fVar89;
  float fVar91;
  float fVar92;
  undefined1 in_XMM11 [16];
  undefined1 auVar90 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 in_XMM12 [16];
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 in_XMM13 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  vint<4> octant;
  undefined1 local_17e8 [8];
  float fStack_17e0;
  float fStack_17dc;
  undefined1 local_17d8 [16];
  RayQueryContext *local_17c8;
  long local_17c0;
  undefined1 local_17b8 [16];
  RTCIntersectFunctionNArguments local_17a0;
  Geometry *local_1770;
  undefined8 local_1768;
  RTCIntersectArguments *local_1760;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1708;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    auVar47._8_4_ = 0xffffffff;
    auVar47._0_8_ = 0xffffffffffffffff;
    auVar47._12_4_ = 0xffffffff;
    auVar48._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
    auVar48._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
    auVar48._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
    auVar48._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
    iVar19 = movmskps((int)This,auVar48);
    uVar20 = CONCAT44((int)((ulong)This >> 0x20),iVar19);
    if (iVar19 != 0) {
      auVar67 = *(undefined1 (*) [16])(ray + 0x40);
      fVar52 = (float)DAT_01ff1d40;
      fVar54 = DAT_01ff1d40._4_4_;
      fVar56 = DAT_01ff1d40._8_4_;
      fVar58 = DAT_01ff1d40._12_4_;
      auVar90._4_4_ = -(uint)(ABS(auVar67._4_4_) < fVar54);
      auVar90._0_4_ = -(uint)(ABS(auVar67._0_4_) < fVar52);
      auVar90._8_4_ = -(uint)(ABS(auVar67._8_4_) < fVar56);
      auVar90._12_4_ = -(uint)(ABS(auVar67._12_4_) < fVar58);
      auVar61 = blendvps(auVar67,_DAT_01ff1d40,auVar90);
      auVar90 = *(undefined1 (*) [16])(ray + 0x50);
      auVar73._4_4_ = -(uint)(ABS(auVar90._4_4_) < fVar54);
      auVar73._0_4_ = -(uint)(ABS(auVar90._0_4_) < fVar52);
      auVar73._8_4_ = -(uint)(ABS(auVar90._8_4_) < fVar56);
      auVar73._12_4_ = -(uint)(ABS(auVar90._12_4_) < fVar58);
      auVar73 = blendvps(auVar90,_DAT_01ff1d40,auVar73);
      auVar90 = *(undefined1 (*) [16])(ray + 0x60);
      auVar79._4_4_ = -(uint)(ABS(auVar90._4_4_) < fVar54);
      auVar79._0_4_ = -(uint)(ABS(auVar90._0_4_) < fVar52);
      auVar79._8_4_ = -(uint)(ABS(auVar90._8_4_) < fVar56);
      auVar79._12_4_ = -(uint)(ABS(auVar90._12_4_) < fVar58);
      auVar79 = blendvps(auVar90,_DAT_01ff1d40,auVar79);
      auVar90 = rcpps(in_XMM11,auVar61);
      fVar89 = auVar90._0_4_;
      fVar91 = auVar90._4_4_;
      fVar92 = auVar90._8_4_;
      fVar93 = auVar90._12_4_;
      auVar90 = rcpps(in_XMM12,auVar73);
      fVar94 = auVar90._0_4_;
      fVar95 = auVar90._4_4_;
      fVar96 = auVar90._8_4_;
      fVar97 = auVar90._12_4_;
      auVar90 = rcpps(in_XMM13,auVar79);
      fVar98 = auVar90._0_4_;
      fVar99 = auVar90._4_4_;
      fVar100 = auVar90._8_4_;
      fVar101 = auVar90._12_4_;
      auVar74._0_12_ = ZEXT812(0);
      auVar74._12_4_ = 0;
      auVar90 = maxps(*(undefined1 (*) [16])(ray + 0x80),auVar74);
      auVar66._0_8_ =
           CONCAT44(-(uint)(auVar67._4_4_ < 0.0),-(uint)(auVar67._0_4_ < 0.0)) & 0x100000001;
      auVar66._8_4_ = -(uint)(auVar67._8_4_ < 0.0) & 1;
      auVar66._12_4_ = -(uint)(auVar67._12_4_ < 0.0) & 1;
      auVar80._0_8_ =
           CONCAT44(-(uint)(*(float *)(ray + 0x54) < 0.0),-(uint)(*(float *)(ray + 0x50) < 0.0)) &
           0x200000002;
      auVar80._8_4_ = -(uint)(*(float *)(ray + 0x58) < 0.0) & 2;
      auVar80._12_4_ = -(uint)(*(float *)(ray + 0x5c) < 0.0) & 2;
      fVar52 = *(float *)ray;
      fVar54 = *(float *)(ray + 4);
      fVar56 = *(float *)(ray + 8);
      fVar58 = *(float *)(ray + 0xc);
      fVar102 = *(float *)(ray + 0x10);
      fVar103 = *(float *)(ray + 0x14);
      fVar104 = *(float *)(ray + 0x18);
      fVar105 = *(float *)(ray + 0x1c);
      auVar67._0_8_ =
           CONCAT44(-(uint)(*(float *)(ray + 100) < 0.0),-(uint)(*(float *)(ray + 0x60) < 0.0)) &
           0x400000004;
      auVar67._8_4_ = -(uint)(*(float *)(ray + 0x68) < 0.0) & 4;
      auVar67._12_4_ = -(uint)(*(float *)(ray + 0x6c) < 0.0) & 4;
      local_16f8 = *(undefined8 *)(ray + 0x20);
      uStack_16f0 = *(undefined8 *)(ray + 0x28);
      local_17d8 = auVar48 ^ auVar47 | auVar67 | auVar80 | auVar66;
      do {
        lVar16 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
          }
        }
        iVar19 = *(int *)(local_17d8 + lVar16 * 4);
        auVar68._0_4_ = -(uint)(iVar19 == local_17d8._0_4_);
        auVar68._4_4_ = -(uint)(iVar19 == local_17d8._4_4_);
        auVar68._8_4_ = -(uint)(iVar19 == local_17d8._8_4_);
        auVar68._12_4_ = -(uint)(iVar19 == local_17d8._12_4_);
        uVar13 = movmskps((int)lVar16,auVar68);
        uVar15 = ~CONCAT44((int)((ulong)lVar16 >> 0x20),uVar13);
        uVar20 = uVar20 & uVar15;
      } while (uVar20 != 0);
      auVar32._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
      auVar32._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
      auVar32._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
      auVar32._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
      fVar89 = fVar89 + (1.0 - auVar61._0_4_ * fVar89) * fVar89;
      fVar91 = fVar91 + (1.0 - auVar61._4_4_ * fVar91) * fVar91;
      fVar92 = fVar92 + (1.0 - auVar61._8_4_ * fVar92) * fVar92;
      fVar93 = fVar93 + (1.0 - auVar61._12_4_ * fVar93) * fVar93;
      fVar94 = fVar94 + (1.0 - auVar73._0_4_ * fVar94) * fVar94;
      fVar95 = fVar95 + (1.0 - auVar73._4_4_ * fVar95) * fVar95;
      fVar96 = fVar96 + (1.0 - auVar73._8_4_ * fVar96) * fVar96;
      fVar97 = fVar97 + (1.0 - auVar73._12_4_ * fVar97) * fVar97;
      fVar98 = fVar98 + (1.0 - auVar79._0_4_ * fVar98) * fVar98;
      fVar99 = fVar99 + (1.0 - auVar79._4_4_ * fVar99) * fVar99;
      fVar100 = fVar100 + (1.0 - auVar79._8_4_ * fVar100) * fVar100;
      fVar101 = fVar101 + (1.0 - auVar79._12_4_ * fVar101) * fVar101;
      auVar48 = maxps(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0));
      local_1708.v = (__m128)blendvps(_DAT_01feb9f0,auVar48,auVar32);
      _local_17e8 = blendvps(_DAT_01feba00,auVar90,auVar32);
      pNVar22 = stack_node + 2;
      paVar23 = &stack_near[2].field_0;
      local_17d8 = auVar32 | local_17d8;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01feb9f0;
      sVar11 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      stack_node[1].ptr = sVar11;
      stack_near[1].field_0 = local_1708;
      do {
        paVar23 = paVar23 + -1;
        sVar18 = pNVar22[-1].ptr;
        pNVar22 = pNVar22 + -1;
        sVar11 = CONCAT71((int7)(sVar11 >> 8),1);
        if (sVar18 != 0xfffffffffffffff8) {
          aVar39.v = *(__m128 *)paVar23->v;
          auVar61._4_4_ = -(uint)(aVar39.v[1] < (float)local_17e8._4_4_);
          auVar61._0_4_ = -(uint)(aVar39.v[0] < (float)local_17e8._0_4_);
          auVar61._8_4_ = -(uint)(aVar39.v[2] < fStack_17e0);
          auVar61._12_4_ = -(uint)(aVar39.v[3] < fStack_17dc);
          uVar14 = movmskps((int)uVar15,auVar61);
          uVar15 = (ulong)uVar14;
          if (uVar14 != 0) {
            do {
              fVar31 = aVar39.v[0];
              fVar34 = aVar39.v[1];
              fVar35 = aVar39.v[2];
              fVar36 = aVar39.v[3];
              uVar14 = (uint)sVar18;
              if ((sVar18 & 8) != 0) {
                if (sVar18 == 0xfffffffffffffff8) goto LAB_00257638;
                local_17b8._4_4_ = -(uint)(fVar34 < (float)local_17e8._4_4_);
                local_17b8._0_4_ = -(uint)(fVar31 < (float)local_17e8._0_4_);
                local_17b8._8_4_ = -(uint)(fVar35 < fStack_17e0);
                local_17b8._12_4_ = -(uint)(fVar36 < fStack_17dc);
                iVar19 = movmskps((int)sVar11,local_17b8);
                if (iVar19 != 0) {
                  local_17c0 = (ulong)(uVar14 & 0xf) - 8;
                  if (local_17c0 != 0) {
                    lVar16 = 0;
                    local_17c8 = context;
                    local_1718 = fVar89;
                    fStack_1714 = fVar91;
                    fStack_1710 = fVar92;
                    fStack_170c = fVar93;
                    local_1728 = fVar94;
                    fStack_1724 = fVar95;
                    fStack_1720 = fVar96;
                    fStack_171c = fVar97;
                    local_1738 = fVar98;
                    fStack_1734 = fVar99;
                    fStack_1730 = fVar100;
                    fStack_172c = fVar101;
                    local_1748 = fVar52;
                    fStack_1744 = fVar54;
                    fStack_1740 = fVar56;
                    fStack_173c = fVar58;
                    local_1758 = fVar102;
                    fStack_1754 = fVar103;
                    fStack_1750 = fVar104;
                    fStack_174c = fVar105;
                    do {
                      local_17a0.geomID = *(uint *)((sVar18 & 0xfffffffffffffff0) + lVar16 * 8);
                      local_1770 = (context->scene->geometries).items[local_17a0.geomID].ptr;
                      uVar14 = local_1770->mask;
                      auVar30._0_4_ = -(uint)((uVar14 & *(uint *)(ray + 0x90)) == 0);
                      auVar30._4_4_ = -(uint)((uVar14 & *(uint *)(ray + 0x94)) == 0);
                      auVar30._8_4_ = -(uint)((uVar14 & *(uint *)(ray + 0x98)) == 0);
                      auVar30._12_4_ = -(uint)((uVar14 & *(uint *)(ray + 0x9c)) == 0);
                      mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                     (~auVar30 & local_17b8);
                      uVar14 = movmskps((int)uVar15,(undefined1  [16])mask.field_0);
                      uVar15 = (ulong)uVar14;
                      if (uVar14 != 0) {
                        local_17a0.primID =
                             *(uint *)((sVar18 & 0xfffffffffffffff0) + 4 + lVar16 * 8);
                        local_17a0.valid = (int *)&mask;
                        local_17a0.geometryUserPtr = local_1770->userPtr;
                        local_17a0.context = context->user;
                        local_17a0.N = 4;
                        local_1768 = 0;
                        local_1760 = context->args;
                        pp_Var12 = (_func_int **)local_1760->intersect;
                        if (pp_Var12 == (_func_int **)0x0) {
                          pp_Var12 = local_1770[1].super_RefCount._vptr_RefCount;
                        }
                        local_17a0.rayhit = (RTCRayHitN *)ray;
                        (*(code *)pp_Var12)(&local_17a0);
                        context = local_17c8;
                        uVar15 = extraout_RDX;
                        fVar52 = local_1748;
                        fVar54 = fStack_1744;
                        fVar56 = fStack_1740;
                        fVar58 = fStack_173c;
                        fVar102 = local_1758;
                        fVar103 = fStack_1754;
                        fVar104 = fStack_1750;
                        fVar105 = fStack_174c;
                        fVar89 = local_1718;
                        fVar91 = fStack_1714;
                        fVar92 = fStack_1710;
                        fVar93 = fStack_170c;
                        fVar94 = local_1728;
                        fVar95 = fStack_1724;
                        fVar96 = fStack_1720;
                        fVar97 = fStack_171c;
                        fVar98 = local_1738;
                        fVar99 = fStack_1734;
                        fVar100 = fStack_1730;
                        fVar101 = fStack_172c;
                      }
                      lVar16 = lVar16 + 1;
                    } while (local_17c0 != lVar16);
                  }
                  _local_17e8 = blendvps(_local_17e8,*(undefined1 (*) [16])(ray + 0x80),local_17b8);
                }
                break;
              }
              uVar15 = sVar18 & 0xfffffffffffffff0;
              uVar21 = 0;
              sVar17 = 8;
              uVar20 = 0;
              aVar33 = _DAT_01feb9f0;
              do {
                sVar3 = *(size_t *)(uVar15 + uVar20 * 8);
                sVar18 = sVar17;
                aVar39 = aVar33;
                if (sVar3 != 8) {
                  fVar45 = *(float *)(uVar15 + 0x80 + uVar20 * 4);
                  fVar46 = *(float *)(uVar15 + 0x20 + uVar20 * 4);
                  fVar64 = *(float *)(uVar15 + 0x30 + uVar20 * 4);
                  fVar51 = *(float *)(uVar15 + 0x40 + uVar20 * 4);
                  fVar65 = *(float *)(uVar15 + 0x50 + uVar20 * 4);
                  fVar7 = *(float *)(ray + 0x70);
                  fVar8 = *(float *)(ray + 0x74);
                  fVar9 = *(float *)(ray + 0x78);
                  fVar10 = *(float *)(ray + 0x7c);
                  fVar53 = *(float *)(uVar15 + 0xa0 + uVar20 * 4);
                  fVar59 = *(float *)(uVar15 + 0xc0 + uVar20 * 4);
                  fVar60 = *(float *)(uVar15 + 0x60 + uVar20 * 4);
                  fVar69 = *(float *)(uVar15 + 0x90 + uVar20 * 4);
                  fVar70 = *(float *)(uVar15 + 0xb0 + uVar20 * 4);
                  fVar71 = *(float *)(uVar15 + 0xd0 + uVar20 * 4);
                  fVar1 = *(float *)(uVar15 + 0x70 + uVar20 * 4);
                  fVar37 = ((fVar45 * fVar7 + fVar46) - fVar52) * fVar89;
                  fVar43 = ((fVar45 * fVar8 + fVar46) - fVar54) * fVar91;
                  fVar44 = ((fVar45 * fVar9 + fVar46) - fVar56) * fVar92;
                  fVar45 = ((fVar45 * fVar10 + fVar46) - fVar58) * fVar93;
                  fVar46 = ((fVar53 * fVar7 + fVar51) - fVar102) * fVar94;
                  fVar49 = ((fVar53 * fVar8 + fVar51) - fVar103) * fVar95;
                  fVar50 = ((fVar53 * fVar9 + fVar51) - fVar104) * fVar96;
                  fVar51 = ((fVar53 * fVar10 + fVar51) - fVar105) * fVar97;
                  fVar53 = ((fVar59 * fVar7 + fVar60) - (float)local_16f8) * fVar98;
                  fVar55 = ((fVar59 * fVar8 + fVar60) - local_16f8._4_4_) * fVar99;
                  fVar57 = ((fVar59 * fVar9 + fVar60) - (float)uStack_16f0) * fVar100;
                  fVar59 = ((fVar59 * fVar10 + fVar60) - uStack_16f0._4_4_) * fVar101;
                  fVar60 = ((fVar69 * fVar7 + fVar64) - fVar52) * fVar89;
                  fVar62 = ((fVar69 * fVar8 + fVar64) - fVar54) * fVar91;
                  fVar63 = ((fVar69 * fVar9 + fVar64) - fVar56) * fVar92;
                  fVar64 = ((fVar69 * fVar10 + fVar64) - fVar58) * fVar93;
                  fVar72 = ((fVar70 * fVar7 + fVar65) - fVar102) * fVar94;
                  fVar75 = ((fVar70 * fVar8 + fVar65) - fVar103) * fVar95;
                  fVar76 = ((fVar70 * fVar9 + fVar65) - fVar104) * fVar96;
                  fVar77 = ((fVar70 * fVar10 + fVar65) - fVar105) * fVar97;
                  fVar65 = ((fVar71 * fVar7 + fVar1) - (float)local_16f8) * fVar98;
                  fVar69 = ((fVar71 * fVar8 + fVar1) - local_16f8._4_4_) * fVar99;
                  fVar70 = ((fVar71 * fVar9 + fVar1) - (float)uStack_16f0) * fVar100;
                  fVar71 = ((fVar71 * fVar10 + fVar1) - uStack_16f0._4_4_) * fVar101;
                  uVar78 = (uint)((int)fVar60 < (int)fVar37) * (int)fVar60 |
                           (uint)((int)fVar60 >= (int)fVar37) * (int)fVar37;
                  uVar82 = (uint)((int)fVar62 < (int)fVar43) * (int)fVar62 |
                           (uint)((int)fVar62 >= (int)fVar43) * (int)fVar43;
                  uVar83 = (uint)((int)fVar63 < (int)fVar44) * (int)fVar63 |
                           (uint)((int)fVar63 >= (int)fVar44) * (int)fVar44;
                  uVar84 = (uint)((int)fVar64 < (int)fVar45) * (int)fVar64 |
                           (uint)((int)fVar64 >= (int)fVar45) * (int)fVar45;
                  uVar85 = (uint)((int)fVar72 < (int)fVar46) * (int)fVar72 |
                           (uint)((int)fVar72 >= (int)fVar46) * (int)fVar46;
                  uVar86 = (uint)((int)fVar75 < (int)fVar49) * (int)fVar75 |
                           (uint)((int)fVar75 >= (int)fVar49) * (int)fVar49;
                  uVar87 = (uint)((int)fVar76 < (int)fVar50) * (int)fVar76 |
                           (uint)((int)fVar76 >= (int)fVar50) * (int)fVar50;
                  uVar88 = (uint)((int)fVar77 < (int)fVar51) * (int)fVar77 |
                           (uint)((int)fVar77 >= (int)fVar51) * (int)fVar51;
                  uVar85 = ((int)uVar85 < (int)uVar78) * uVar78 |
                           ((int)uVar85 >= (int)uVar78) * uVar85;
                  uVar86 = ((int)uVar86 < (int)uVar82) * uVar82 |
                           ((int)uVar86 >= (int)uVar82) * uVar86;
                  uVar87 = ((int)uVar87 < (int)uVar83) * uVar83 |
                           ((int)uVar87 >= (int)uVar83) * uVar87;
                  uVar88 = ((int)uVar88 < (int)uVar84) * uVar84 |
                           ((int)uVar88 >= (int)uVar84) * uVar88;
                  uVar78 = (uint)((int)fVar65 < (int)fVar53) * (int)fVar65 |
                           (uint)((int)fVar65 >= (int)fVar53) * (int)fVar53;
                  uVar82 = (uint)((int)fVar69 < (int)fVar55) * (int)fVar69 |
                           (uint)((int)fVar69 >= (int)fVar55) * (int)fVar55;
                  uVar83 = (uint)((int)fVar70 < (int)fVar57) * (int)fVar70 |
                           (uint)((int)fVar70 >= (int)fVar57) * (int)fVar57;
                  uVar84 = (uint)((int)fVar71 < (int)fVar59) * (int)fVar71 |
                           (uint)((int)fVar71 >= (int)fVar59) * (int)fVar59;
                  auVar81._0_4_ =
                       ((int)uVar78 < (int)uVar85) * uVar85 | ((int)uVar78 >= (int)uVar85) * uVar78;
                  auVar81._4_4_ =
                       ((int)uVar82 < (int)uVar86) * uVar86 | ((int)uVar82 >= (int)uVar86) * uVar82;
                  auVar81._8_4_ =
                       ((int)uVar83 < (int)uVar87) * uVar87 | ((int)uVar83 >= (int)uVar87) * uVar83;
                  auVar81._12_4_ =
                       ((int)uVar84 < (int)uVar88) * uVar88 | ((int)uVar84 >= (int)uVar88) * uVar84;
                  uVar78 = (uint)((int)fVar60 < (int)fVar37) * (int)fVar37 |
                           (uint)((int)fVar60 >= (int)fVar37) * (int)fVar60;
                  uVar82 = (uint)((int)fVar62 < (int)fVar43) * (int)fVar43 |
                           (uint)((int)fVar62 >= (int)fVar43) * (int)fVar62;
                  uVar83 = (uint)((int)fVar63 < (int)fVar44) * (int)fVar44 |
                           (uint)((int)fVar63 >= (int)fVar44) * (int)fVar63;
                  uVar84 = (uint)((int)fVar64 < (int)fVar45) * (int)fVar45 |
                           (uint)((int)fVar64 >= (int)fVar45) * (int)fVar64;
                  uVar85 = (uint)((int)fVar72 < (int)fVar46) * (int)fVar46 |
                           (uint)((int)fVar72 >= (int)fVar46) * (int)fVar72;
                  uVar86 = (uint)((int)fVar75 < (int)fVar49) * (int)fVar49 |
                           (uint)((int)fVar75 >= (int)fVar49) * (int)fVar75;
                  uVar87 = (uint)((int)fVar76 < (int)fVar50) * (int)fVar50 |
                           (uint)((int)fVar76 >= (int)fVar50) * (int)fVar76;
                  uVar88 = (uint)((int)fVar77 < (int)fVar51) * (int)fVar51 |
                           (uint)((int)fVar77 >= (int)fVar51) * (int)fVar77;
                  uVar85 = ((int)uVar78 < (int)uVar85) * uVar78 |
                           ((int)uVar78 >= (int)uVar85) * uVar85;
                  uVar86 = ((int)uVar82 < (int)uVar86) * uVar82 |
                           ((int)uVar82 >= (int)uVar86) * uVar86;
                  uVar87 = ((int)uVar83 < (int)uVar87) * uVar83 |
                           ((int)uVar83 >= (int)uVar87) * uVar87;
                  uVar88 = ((int)uVar84 < (int)uVar88) * uVar84 |
                           ((int)uVar84 >= (int)uVar88) * uVar88;
                  uVar78 = (uint)((int)fVar65 < (int)fVar53) * (int)fVar53 |
                           (uint)((int)fVar65 >= (int)fVar53) * (int)fVar65;
                  uVar82 = (uint)((int)fVar69 < (int)fVar55) * (int)fVar55 |
                           (uint)((int)fVar69 >= (int)fVar55) * (int)fVar69;
                  uVar83 = (uint)((int)fVar70 < (int)fVar57) * (int)fVar57 |
                           (uint)((int)fVar70 >= (int)fVar57) * (int)fVar70;
                  uVar84 = (uint)((int)fVar71 < (int)fVar59) * (int)fVar59 |
                           (uint)((int)fVar71 >= (int)fVar59) * (int)fVar71;
                  uVar78 = (uint)((int)local_17e8._0_4_ < (int)uVar78) * local_17e8._0_4_ |
                           ((int)local_17e8._0_4_ >= (int)uVar78) * uVar78;
                  uVar82 = (uint)((int)local_17e8._4_4_ < (int)uVar82) * local_17e8._4_4_ |
                           ((int)local_17e8._4_4_ >= (int)uVar82) * uVar82;
                  uVar83 = (uint)((int)fStack_17e0 < (int)uVar83) * (int)fStack_17e0 |
                           ((int)fStack_17e0 >= (int)uVar83) * uVar83;
                  uVar84 = (uint)((int)fStack_17dc < (int)uVar84) * (int)fStack_17dc |
                           ((int)fStack_17dc >= (int)uVar84) * uVar84;
                  bVar24 = (float)((uint)((int)auVar81._0_4_ < (int)local_1708._0_4_) *
                                   local_1708._0_4_ |
                                  ((int)auVar81._0_4_ >= (int)local_1708._0_4_) * auVar81._0_4_) <=
                           (float)(((int)uVar85 < (int)uVar78) * uVar85 |
                                  ((int)uVar85 >= (int)uVar78) * uVar78);
                  bVar4 = (float)((uint)((int)auVar81._4_4_ < (int)local_1708._4_4_) *
                                  local_1708._4_4_ |
                                 ((int)auVar81._4_4_ >= (int)local_1708._4_4_) * auVar81._4_4_) <=
                          (float)(((int)uVar86 < (int)uVar82) * uVar86 |
                                 ((int)uVar86 >= (int)uVar82) * uVar82);
                  bVar5 = (float)((uint)((int)auVar81._8_4_ < (int)local_1708._8_4_) *
                                  local_1708._8_4_ |
                                 ((int)auVar81._8_4_ >= (int)local_1708._8_4_) * auVar81._8_4_) <=
                          (float)(((int)uVar87 < (int)uVar83) * uVar87 |
                                 ((int)uVar87 >= (int)uVar83) * uVar83);
                  bVar6 = (float)((uint)((int)auVar81._12_4_ < (int)local_1708._12_4_) *
                                  local_1708._12_4_ |
                                 ((int)auVar81._12_4_ >= (int)local_1708._12_4_) * auVar81._12_4_)
                          <= (float)(((int)uVar88 < (int)uVar84) * uVar88 |
                                    ((int)uVar88 >= (int)uVar84) * uVar84);
                  auVar38._4_4_ = -(uint)bVar4;
                  auVar38._0_4_ = -(uint)bVar24;
                  auVar38._8_4_ = -(uint)bVar5;
                  auVar38._12_4_ = -(uint)bVar6;
                  if ((uVar14 & 7) == 6) {
                    fVar45 = *(float *)(uVar15 + 0xe0 + uVar20 * 4);
                    fVar46 = *(float *)(uVar15 + 0xf0 + uVar20 * 4);
                    auVar38._0_4_ = -(uint)((fVar7 < fVar46 && fVar45 <= fVar7) && bVar24);
                    auVar38._4_4_ = -(uint)((fVar8 < fVar46 && fVar45 <= fVar8) && bVar4);
                    auVar38._8_4_ = -(uint)((fVar9 < fVar46 && fVar45 <= fVar9) && bVar5);
                    auVar38._12_4_ = -(uint)((fVar10 < fVar46 && fVar45 <= fVar10) && bVar6);
                  }
                  auVar25._0_4_ =
                       (-(uint)(fVar31 < (float)local_17e8._0_4_) & auVar38._0_4_) << 0x1f;
                  auVar25._4_4_ =
                       (-(uint)(fVar34 < (float)local_17e8._4_4_) & auVar38._4_4_) << 0x1f;
                  auVar25._8_4_ = (-(uint)(fVar35 < fStack_17e0) & auVar38._8_4_) << 0x1f;
                  auVar25._12_4_ = (-(uint)(fVar36 < fStack_17dc) & auVar38._12_4_) << 0x1f;
                  uVar78 = movmskps((int)in_R9,auVar25);
                  in_R9 = (ulong)uVar78;
                  if (uVar78 != 0) {
                    aVar39.v = (__m128)blendvps(_DAT_01feb9f0,auVar81,auVar25);
                    auVar26._4_4_ = -(uint)(aVar39.v[1] < aVar33.v[1]);
                    auVar26._0_4_ = -(uint)(aVar39.v[0] < aVar33.v[0]);
                    auVar26._8_4_ = -(uint)(aVar39.v[2] < aVar33.v[2]);
                    auVar26._12_4_ = -(uint)(aVar39.v[3] < aVar33.v[3]);
                    iVar19 = movmskps(uVar78,auVar26);
                    in_R9 = sVar3;
                    aVar27 = aVar39;
                    if ((iVar19 == 0) ||
                       (sVar18 = sVar3, in_R9 = sVar17, aVar27 = aVar33, aVar33 = aVar39,
                       sVar17 != 8)) {
                      aVar39 = aVar33;
                      uVar21 = uVar21 + 1;
                      pNVar22->ptr = in_R9;
                      pNVar22 = pNVar22 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar23->v = aVar27;
                      paVar23 = paVar23 + 1;
                    }
                  }
                }
              } while ((sVar3 != 8) &&
                      (bVar24 = uVar20 < 3, sVar17 = sVar18, uVar20 = uVar20 + 1, aVar33 = aVar39,
                      bVar24));
              uVar15 = CONCAT71((int7)(uVar15 >> 8),sVar18 != 8);
              if (1 < uVar21 && sVar18 != 8) {
                vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar23[-2].v;
                auVar40._4_4_ = -(uint)(vVar2.field_0._4_4_ < *(float *)((long)paVar23 + -0xc));
                auVar40._0_4_ = -(uint)(vVar2.field_0._0_4_ < paVar23[-1].v[0]);
                auVar40._8_4_ = -(uint)(vVar2.field_0._8_4_ < *(float *)((long)paVar23 + -8));
                auVar40._12_4_ = -(uint)(vVar2.field_0._12_4_ < *(float *)((long)paVar23 + -4));
                uVar14 = movmskps((int)uVar15,auVar40);
                uVar15 = (ulong)uVar14;
                if (uVar14 != 0) {
                  paVar23[-2].v[0] = paVar23[-1].v[0];
                  *(float *)((long)paVar23 + -0x1c) = *(float *)((long)paVar23 + -0xc);
                  *(float *)((long)paVar23 + -0x18) = *(float *)((long)paVar23 + -8);
                  *(float *)((long)paVar23 + -0x14) = *(float *)((long)paVar23 + -4);
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar23[-1].v = vVar2.field_0;
                  auVar48 = *(undefined1 (*) [16])(pNVar22 + -2);
                  auVar28._0_8_ = auVar48._8_8_;
                  auVar28._8_4_ = auVar48._0_4_;
                  auVar28._12_4_ = auVar48._4_4_;
                  *(undefined1 (*) [16])(pNVar22 + -2) = auVar28;
                }
                if (uVar21 != 2) {
                  fVar31 = paVar23[-3].v[0];
                  fVar34 = *(float *)((long)paVar23 + -0x2c);
                  fVar35 = *(float *)((long)paVar23 + -0x28);
                  fVar36 = *(float *)((long)paVar23 + -0x24);
                  auVar41._4_4_ = -(uint)(fVar34 < *(float *)((long)paVar23 + -0xc));
                  auVar41._0_4_ = -(uint)(fVar31 < paVar23[-1].v[0]);
                  auVar41._8_4_ = -(uint)(fVar35 < *(float *)((long)paVar23 + -8));
                  auVar41._12_4_ = -(uint)(fVar36 < *(float *)((long)paVar23 + -4));
                  uVar14 = movmskps(uVar14,auVar41);
                  uVar20 = (ulong)uVar14;
                  if (uVar14 != 0) {
                    paVar23[-3].v[0] = paVar23[-1].v[0];
                    *(float *)((long)paVar23 + -0x2c) = *(float *)((long)paVar23 + -0xc);
                    *(float *)((long)paVar23 + -0x28) = *(float *)((long)paVar23 + -8);
                    *(float *)((long)paVar23 + -0x24) = *(float *)((long)paVar23 + -4);
                    paVar23[-1].v[0] = fVar31;
                    *(float *)((long)paVar23 + -0xc) = fVar34;
                    *(float *)((long)paVar23 + -8) = fVar35;
                    *(float *)((long)paVar23 + -4) = fVar36;
                    sVar17 = pNVar22[-3].ptr;
                    uVar20 = pNVar22[-1].ptr;
                    pNVar22[-3].ptr = uVar20;
                    pNVar22[-1].ptr = sVar17;
                  }
                  vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar23[-3].v;
                  auVar42._4_4_ = -(uint)(vVar2.field_0._4_4_ < *(float *)((long)paVar23 + -0x1c));
                  auVar42._0_4_ = -(uint)(vVar2.field_0._0_4_ < paVar23[-2].v[0]);
                  auVar42._8_4_ = -(uint)(vVar2.field_0._8_4_ < *(float *)((long)paVar23 + -0x18));
                  auVar42._12_4_ = -(uint)(vVar2.field_0._12_4_ < *(float *)((long)paVar23 + -0x14))
                  ;
                  uVar14 = movmskps((int)uVar20,auVar42);
                  uVar15 = (ulong)uVar14;
                  if (uVar14 != 0) {
                    paVar23[-3].v[0] = paVar23[-2].v[0];
                    *(float *)((long)paVar23 + -0x2c) = *(float *)((long)paVar23 + -0x1c);
                    *(float *)((long)paVar23 + -0x28) = *(float *)((long)paVar23 + -0x18);
                    *(float *)((long)paVar23 + -0x24) = *(float *)((long)paVar23 + -0x14);
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar23[-2].v = vVar2.field_0;
                    auVar48 = *(undefined1 (*) [16])(pNVar22 + -3);
                    auVar29._0_8_ = auVar48._8_8_;
                    auVar29._8_4_ = auVar48._0_4_;
                    auVar29._12_4_ = auVar48._4_4_;
                    *(undefined1 (*) [16])(pNVar22 + -3) = auVar29;
                  }
                }
              }
            } while (sVar18 != 8);
          }
          sVar11 = 0;
        }
LAB_00257638:
      } while ((char)sVar11 == '\0');
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }